

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::ToNumberInPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  double value;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = TaggedInt::Is(aRight);
  aRight_local = aRight;
  if ((!bVar1) && (bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aRight), !bVar1)) {
    value = JavascriptConversion::ToNumber(aRight,scriptContext);
    aRight_local = JavascriptNumber::ToVarInPlace(value,scriptContext,result);
  }
  return aRight_local;
}

Assistant:

Var JavascriptOperators::ToNumberInPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumberInPlace);
        if (TaggedInt::Is(aRight) || JavascriptNumber::Is_NoTaggedIntCheck(aRight))
        {
            return aRight;
        }

        return JavascriptNumber::ToVarInPlace(JavascriptConversion::ToNumber(aRight, scriptContext), scriptContext, result);
        JIT_HELPER_END(Op_ConvNumberInPlace);
    }